

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<int,_Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<int>(BaseDictionary<int,_Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *this,int *key,IDiagObjectAddress **value)

{
  uint uVar1;
  
  uVar1 = FindEntryWithKey<int>(this,key);
  if (-1 < (int)uVar1) {
    *value = this->entries[uVar1].
             super_DefaultHashedEntry<int,_Js::IDiagObjectAddress_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<int,_Js::IDiagObjectAddress_*>.
             super_ValueEntry<Js::IDiagObjectAddress_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::IDiagObjectAddress_*>_>
             .super_KeyValueEntryDataLayout2<int,_Js::IDiagObjectAddress_*>.value;
  }
  return -1 < (int)uVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }